

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-multiply.h
# Opt level: O1

void dynet::MatrixMultiply(Device_CPU *dev,Tensor *l,Tensor *r,Tensor *y,float *acc_scalar)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  type local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_50.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = (long)&local_b8;
  local_b8.m_functor.m_value = *acc_scalar;
  local_b8.m_xpr.m_data = y->v;
  uVar4 = (ulong)(y->d).nd;
  local_70.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = 1;
  local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
  if (uVar4 != 0) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar5 = uVar5 * (y->d).d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar5;
  }
  local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(y->d).bd;
  if (uVar4 != 0) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar5 = uVar5 * (y->d).d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    local_70.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)uVar5;
  }
  local_50.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&local_70;
  local_70.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = local_b8.m_xpr.m_data;
  local_70.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind1st_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind1st_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
         *)&local_50,dev->edevice);
  if (((l->d).bd == 1) && ((r->d).bd == (y->d).bd)) {
    Tensor::operator*(&local_70,l);
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = r->v;
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(r->d).d[0];
    uVar5 = 1;
    if (1 < (r->d).nd) {
      uVar5 = (r->d).d[1];
    }
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)(uVar5 * (r->d).bd);
    local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_b8.m_xpr.m_data =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data;
    local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    if (local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value !=
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) {
LAB_003bf0f9:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
                   );
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = y->v;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(y->d).d[0];
    uVar5 = 1;
    if (1 < (y->d).nd) {
      uVar5 = (y->d).d[1];
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)(uVar5 * (y->d).bd);
    if ((local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) ||
       (local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value !=
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
LAB_003bf118:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                    "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                   );
    }
    Eigen::internal::
    generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (&local_50,
               (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_b8,
               &local_98);
  }
  else {
    uVar5 = (y->d).bd;
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        uVar1 = (l->d).nd;
        iVar6 = 1;
        if ((ulong)uVar1 != 0) {
          uVar4 = 0;
          do {
            iVar6 = iVar6 * (l->d).d[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        iVar8 = 1;
        local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(l->d).d[1];
        if (uVar1 < 2) {
          local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = 1;
        }
        uVar1 = (r->d).nd;
        if ((ulong)uVar1 != 0) {
          uVar4 = 0;
          do {
            iVar8 = iVar8 * (r->d).d[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        uVar2 = (l->d).d[0];
        local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar2;
        local_b8.m_xpr.m_data = l->v + (uVar9 % (l->d).bd) * iVar6;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = r->v + (uVar9 % (r->d).bd) * iVar8;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(r->d).d[1];
        if (uVar1 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        uVar1 = (r->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar1;
        if ((uint)local_b8.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] != uVar1)
        goto LAB_003bf0f9;
        uVar1 = (y->d).nd;
        iVar6 = 1;
        if ((ulong)uVar1 != 0) {
          uVar4 = 0;
          do {
            iVar6 = iVar6 * (y->d).d[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = y->v + (uVar9 % uVar5) * iVar6;
        uVar5 = (y->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar5;
        uVar3 = (y->d).d[1];
        if (uVar1 < 2) {
          uVar3 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar3;
        if ((uVar5 != uVar2) ||
           (local_98.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value !=
            local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value)) goto LAB_003bf118;
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,
                   (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   &local_b8,&local_98);
        uVar9 = uVar9 + 1;
        uVar5 = (y->d).bd;
      } while (uVar9 < uVar5);
    }
  }
  return;
}

Assistant:

inline void MatrixMultiply(const Device_CPU & dev, const Tensor& l, const Tensor& r, Tensor& y, const float* acc_scalar) {

  y.tbvec().device(*dev.edevice) = *acc_scalar * y.tbvec();

  if(l.d.bd == 1 && r.d.bd == y.d.bd) {

      // If the left side has one batch, multiply by columns
      // [x, z, b] = [x, y] * [y, z, b]
      // -> [x, z*b] = [x, y], [y, z*b]
      y.colbatch_matrix().noalias() += *l * r.colbatch_matrix();

  } else {
    // Otherwise, loop over the batches
    DYNET_ASSERT(r.d.bd != 1 || r.d.bd != l.d.bd,
                 "Number of batch elements in matrix multiply must match, but got: " << r.d.bd << ", " << l.d.bd);

    for(unsigned b = 0; b < y.d.bd; ++b)
      y.batch_matrix(b).noalias() += l.batch_matrix(b) * r.batch_matrix(b);

  }
}